

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

void ODDLParser::createPropertyWithData(Text *id,Value *primData,Property **prop)

{
  Property *this;
  Property **prop_local;
  Value *primData_local;
  Text *id_local;
  
  if (primData != (Value *)0x0) {
    this = (Property *)operator_new(0x20);
    Property::Property(this,id);
    *prop = this;
    (*prop)->m_value = primData;
  }
  return;
}

Assistant:

static void createPropertyWithData( Text *id, Value *primData, Property **prop ) {
    if( ddl_nullptr != primData ) {
        ( *prop ) = new Property( id );
        ( *prop )->m_value = primData;
    }
}